

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabin_karp.cpp
# Opt level: O3

int strStr(string *haystack,string *needle)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  undefined1 *local_90;
  size_t local_88;
  undefined1 local_80 [16];
  long local_70;
  long local_68;
  long local_60;
  ulong local_58;
  string *local_50;
  ulong local_48;
  long local_40;
  string *local_38;
  
  local_58 = needle->_M_string_length;
  uVar10 = (uint)haystack->_M_string_length;
  uVar9 = (uint)local_58;
  if (uVar10 == 0) {
    iVar11 = -(uint)(uVar9 != 0);
  }
  else {
    iVar11 = -1;
    if ((int)uVar9 <= (int)uVar10) {
      iVar13 = 1;
      iVar12 = 0;
      if (0 < (int)uVar9) {
        uVar6 = local_58 & 0xffffffff;
        do {
          iVar13 = (iVar13 * 0x1f) % 1000000;
          uVar8 = (int)uVar6 - 1;
          uVar6 = (ulong)uVar8;
        } while (uVar8 != 0);
        iVar12 = 0;
        if (0 < (int)uVar9) {
          uVar6 = 0;
          iVar12 = 0;
          do {
            iVar12 = ((int)(needle->_M_dataplus)._M_p[uVar6] + iVar12 * 0x1f) % 1000000;
            uVar6 = uVar6 + 1;
          } while ((uVar9 & 0x7fffffff) != uVar6);
        }
      }
      if (0 < (int)uVar10) {
        local_40 = (long)(int)uVar9;
        local_70 = (long)(int)(uVar9 - 1);
        uVar6 = (ulong)(uVar10 & 0x7fffffff);
        local_68 = 1 - local_40;
        local_60 = -local_40;
        uVar7 = 0;
        iVar11 = 0;
        local_50 = haystack;
        local_48 = uVar6;
        local_38 = needle;
        do {
          pcVar1 = (local_50->_M_dataplus)._M_p;
          iVar11 = ((int)pcVar1[uVar7] + iVar11 * 0x1f) % 1000000;
          if (local_70 <= (long)uVar7) {
            if (local_40 <= (long)uVar7) {
              iVar3 = pcVar1[uVar7 + local_60] * iVar13;
              iVar3 = iVar11 + ((iVar3 / 1000000) * 1000000 - iVar3);
              iVar11 = iVar3 + 1000000;
              if (-1 < iVar3) {
                iVar11 = iVar3;
              }
            }
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," hash_code: ",0xc);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," target_code: ",0xe);
            plVar5 = (long *)std::ostream::operator<<(poVar4,iVar12);
            std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
            std::ostream::put((char)plVar5);
            std::ostream::flush();
            uVar6 = local_48;
            if (iVar11 == iVar12) {
              std::__cxx11::string::substr((ulong)&local_90,(ulong)local_50);
              puVar2 = local_90;
              if (local_88 == local_38->_M_string_length) {
                if (local_88 == 0) {
                  bVar14 = true;
                }
                else {
                  iVar11 = bcmp(local_90,(local_38->_M_dataplus)._M_p,local_88);
                  bVar14 = iVar11 == 0;
                }
              }
              else {
                bVar14 = false;
              }
              if (puVar2 != local_80) {
                operator_delete(puVar2);
              }
              uVar6 = local_48;
              iVar11 = iVar12;
              if (bVar14) {
                return ((int)uVar7 - (int)local_58) + 1;
              }
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
        iVar11 = -1;
      }
    }
  }
  return iVar11;
}

Assistant:

int strStr(std::string haystack, std::string needle) 
{
    int needle_size = needle.length();
    int haystack_size = haystack.length();
    if(haystack_size == 0 )
    {
        if (needle_size ==0)
        {
            return 0;
        }
        else 
        {
            return -1;
        }
    }
    else if(haystack_size<needle_size)
    {
        return -1;
    }
    // using Rabin-Karp algorithm
    static const int kBase = 1000000;
    static const int kHashNum = 31;
    int power = 1.0;
    for(int i = 0; i < needle_size;++i)
    {
        power = (power*kHashNum)%kBase;
    }

    int target_code = 0;
    for(int i = 0; i<needle_size;++i)
    {
        target_code = (target_code*kHashNum+needle[i])%kBase;
    }

    int hash_code = 0;
    for(int i = 0; i<haystack_size;++i)
    {
        // abc+d
        hash_code = (hash_code*kHashNum+haystack[i])%kBase;
        if(i<needle_size-1)
        {
            continue;
        }
        // abcd-a
        if(i>=needle_size)
        {
            hash_code = hash_code -(haystack[i-needle_size]*power)%kBase;
            if(hash_code<0)
            {
                hash_code+=kBase;
            }
        }
        std::cout<<i<<" hash_code: "<< hash_code
                 <<" target_code: "<< target_code <<std::endl;
        // double check the std::string
        if(hash_code==target_code)
        {
            if(haystack.substr(i-needle_size+1,needle_size)==needle)
            {
                return i-needle_size+1;
            }
        }
    }
    return -1;
}